

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O2

void __thiscall soplex::IdxSet::IdxSet(IdxSet *this,IdxSet *old)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  
  this->_vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
  iVar3 = old->len;
  this->len = iVar3;
  this->idx = (int *)0x0;
  spx_alloc<int*>(&this->idx,iVar3);
  piVar1 = old->idx;
  piVar2 = this->idx;
  iVar3 = 0;
  while (this->num = iVar3, iVar3 < old->num) {
    piVar2[iVar3] = piVar1[iVar3];
    iVar3 = this->num + 1;
  }
  this->freeArray = true;
  return;
}

Assistant:

IdxSet::IdxSet(const IdxSet& old)
   : len(old.len)
   , idx(nullptr)
{
   spx_alloc(idx, len);

   for(num = 0; num < old.num; num++)
      idx[num] = old.idx[num];

   freeArray = true;

   assert(size() == old.size());
   assert(size() <= max());
   assert(isConsistent());
}